

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O0

int QuickSelect(int *arr,int left,int right,int k)

{
  int iVar1;
  int p;
  int r;
  int k_local;
  int right_local;
  int left_local;
  int *arr_local;
  
  if (left < right) {
    iVar1 = partition(arr,left,right,(right + left) / 2);
    if (k < iVar1) {
      arr_local._4_4_ = QuickSelect(arr,left,iVar1 + -1,k);
    }
    else if (iVar1 < k) {
      arr_local._4_4_ = QuickSelect(arr,iVar1 + 1,right,k);
    }
    else {
      arr_local._4_4_ = arr[iVar1];
    }
  }
  else {
    arr_local._4_4_ = arr[left];
  }
  return arr_local._4_4_;
}

Assistant:

int QuickSelect(int arr[], int left, int right, int k)
{
	int r, p;
	if (right<=left) {
		return arr[left];
	}
	else {
		p = (right + left) / 2;
		r = partition(arr, left, right, p);
		if (k < r) {
			return QuickSelect(arr, left, r - 1, k);
		}
		if (k > r) {
			return QuickSelect(arr, r + 1, right, k);
		}
		return arr[r];
	}
}